

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  glslopt_ctx *ctx;
  size_t sVar2;
  char *pcVar3;
  FILE *pFVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  glslopt_shader *shader;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  glslopt_target target;
  uint uVar11;
  byte bVar12;
  char *pcVar13;
  int local_38;
  
  if (argc < 3) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar13 = (char *)0x0;
    uVar9 = 1;
    target = kGlslTargetOpenGL;
    bVar12 = 0;
    pcVar3 = (char *)0x0;
    do {
      pcVar7 = argv[uVar9];
      pcVar8 = pcVar3;
      if (*pcVar7 == '-') {
        uVar11 = (byte)pcVar7[1] - 0x76;
        if (uVar11 == 0) {
          uVar11 = (uint)(byte)pcVar7[2];
        }
        if (uVar11 == 0) {
          bVar12 = 1;
        }
        else {
          uVar11 = (byte)pcVar7[1] - 0x66;
          if (uVar11 == 0) {
            uVar11 = (uint)(byte)pcVar7[2];
          }
          if (uVar11 == 0) {
            bVar12 = 0;
          }
          else {
            uVar11 = (byte)pcVar7[1] - 0x31;
            if (uVar11 == 0) {
              uVar11 = (uint)(byte)pcVar7[2];
            }
            if (uVar11 == 0) {
              target = kGlslTargetOpenGL;
            }
            else {
              uVar11 = (byte)pcVar7[1] - 0x32;
              if (uVar11 == 0) {
                uVar11 = (uint)(byte)pcVar7[2];
              }
              if (uVar11 == 0) {
                target = kGlslTargetOpenGLES20;
              }
              else {
                uVar11 = (byte)pcVar7[1] - 0x33;
                if (uVar11 == 0) {
                  uVar11 = (uint)(byte)pcVar7[2];
                }
                if (uVar11 == 0) {
                  target = kGlslTargetOpenGLES30;
                }
              }
            }
          }
        }
      }
      else {
        pcVar8 = pcVar7;
        if ((pcVar3 != (char *)0x0) && (pcVar8 = pcVar3, pcVar13 == (char *)0x0)) {
          pcVar13 = pcVar7;
        }
      }
      uVar9 = uVar9 + 1;
      pcVar3 = pcVar8;
    } while ((uint)argc != uVar9);
    if (pcVar8 != (char *)0x0) {
      ctx = glslopt_initialize(target);
      if (ctx == (glslopt_ctx *)0x0) {
        puts("Failed to initialize glslopt!");
        return 1;
      }
      pcVar3 = pcVar13;
      if (pcVar13 == (char *)0x0) {
        sVar2 = strlen(pcVar8);
        pcVar3 = (char *)calloc(sVar2 + 5,1);
        snprintf(pcVar3,sVar2 + 5,"%s.out",pcVar8);
      }
      pFVar4 = fopen(pcVar8,"rt");
      if (pFVar4 == (FILE *)0x0) {
        printf("Failed to open %s for reading\n",pcVar8);
        iVar10 = 1;
      }
      else {
        fseek(pFVar4,0,2);
        lVar5 = ftell(pFVar4);
        fseek(pFVar4,0,0);
        uVar6 = (ulong)((int)lVar5 + 1);
        uVar9 = 0xffffffffffffffff;
        if (-1 < (long)uVar6) {
          uVar9 = uVar6;
        }
        pcVar7 = (char *)operator_new__(uVar9);
        sVar2 = fread(pcVar7,1,(long)(int)lVar5,pFVar4);
        pcVar7[(int)sVar2] = '\0';
        fclose(pFVar4);
        shader = glslopt_optimize(ctx,(uint)(~bVar12 & 1),pcVar7,0);
        bVar1 = glslopt_get_status(shader);
        if (bVar1) {
          pcVar8 = glslopt_get_output(shader);
          sVar2 = strlen(pcVar8);
          pFVar4 = fopen(pcVar3,"wt");
          if (pFVar4 == (FILE *)0x0) {
            printf("Failed to open %s for writing\n",pcVar3);
          }
          else {
            local_38 = (int)sVar2;
            sVar2 = fwrite(pcVar8,(long)local_38,1,pFVar4);
            if (sVar2 == 1) {
              fclose(pFVar4);
              operator_delete__(pcVar7);
              iVar10 = 0;
              goto LAB_0014e83c;
            }
            printf("Failed to write to %s\n",pcVar3);
            fclose(pFVar4);
          }
          iVar10 = 1;
        }
        else {
          pcVar7 = glslopt_get_log(shader);
          printf("Failed to compile %s:\n\n%s\n",pcVar8,pcVar7);
          iVar10 = 1;
        }
      }
LAB_0014e83c:
      if (pcVar13 == (char *)0x0) {
        free(pcVar3);
      }
      glslopt_cleanup(ctx);
      return iVar10;
    }
    pcVar3 = "Must give a source";
  }
  printhelp(pcVar3);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
		return printhelp(NULL);

	bool vertexShader = false, freename = false;
	glslopt_target languageTarget = kGlslTargetOpenGL;
	const char* source = 0;
	char* dest = 0;

	for( int i=1; i < argc; i++ )
	{
		if( argv[i][0] == '-' )
		{
			if( 0 == strcmp("-v", argv[i]) )
				vertexShader = true;
			else if( 0 == strcmp("-f", argv[i]) )
				vertexShader = false;
			else if( 0 == strcmp("-1", argv[i]) )
				languageTarget = kGlslTargetOpenGL;
			else if( 0 == strcmp("-2", argv[i]) )
				languageTarget = kGlslTargetOpenGLES20;
			else if( 0 == strcmp("-3", argv[i]) )
				languageTarget = kGlslTargetOpenGLES30;
		}
		else
		{
			if( source == 0 )
				source = argv[i];
			else if( dest == 0 )
				dest = argv[i];
		}
	}

	if( !source )
		return printhelp("Must give a source");

	if( !init(languageTarget) )
	{
		printf("Failed to initialize glslopt!\n");
		return 1;
	}

	if ( !dest ) {
		dest = (char *) calloc(strlen(source)+5, sizeof(char));
		snprintf(dest, strlen(source)+5, "%s.out", source);
		freename = true;
	}

	int result = 0;
	if( !compileShader(dest, source, vertexShader) )
		result = 1;

	if( freename ) free(dest);

	term();
	return result;
}